

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>::find<kj::StringPtr,char_const(&)[6]>
          (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this,ArrayPtr<kj::StringPtr> table
          ,char (*params) [7])

{
  ArrayPtr<kj::StringPtr> table_00;
  StringPtr a;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  StringPtr *pSVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  StringHasher *this_00;
  char *in_R8;
  Maybe<unsigned_long> MVar6;
  ulong local_98;
  ArrayPtr<const_char> local_90;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *local_80;
  StringPtr *local_78;
  char *local_70;
  size_t local_68;
  HashBucket *local_58;
  HashBucket *bucket;
  undefined1 auStack_48 [4];
  uint i;
  uint local_38;
  uint hashCode;
  char (*params_local) [7];
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::StringPtr> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.size_;
  this_00 = (StringHasher *)table.ptr;
  _hashCode = in_R8;
  params_local = (char (*) [7])this_00;
  table_local.ptr = (StringPtr *)params;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)(this_00 + 0x10));
  if (sVar3 == 0) {
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
    aVar5 = extraout_RDX;
  }
  else {
    StringPtr::StringPtr((StringPtr *)auStack_48,_hashCode);
    uVar2 = kj::_::anon_unknown_0::StringHasher::hashCode(this_00,(StringPtr)_auStack_48);
    local_38 = uVar2;
    sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)(this_00 + 0x10));
    bucket._4_4_ = kj::_::chooseBucket(uVar2,(uint)sVar3);
    while( true ) {
      local_58 = Array<kj::_::HashBucket>::operator[]
                           ((Array<kj::_::HashBucket> *)(this_00 + 0x10),(ulong)bucket._4_4_);
      bVar1 = kj::_::HashBucket::isEmpty(local_58);
      if (bVar1) break;
      bVar1 = kj::_::HashBucket::isErased(local_58);
      if ((!bVar1) && (local_58->hash == local_38)) {
        local_80 = this_local;
        local_78 = table_local.ptr;
        table_00.size_ = (size_t)table_local.ptr;
        table_00.ptr = (StringPtr *)this_local;
        pSVar4 = kj::_::HashBucket::getRow<kj::StringPtr>(local_58,table_00);
        local_70 = (pSVar4->content).ptr;
        local_68 = (pSVar4->content).size_;
        StringPtr::StringPtr((StringPtr *)&local_90,_hashCode);
        a.content.size_ = local_68;
        a.content.ptr = local_70;
        bVar1 = kj::_::anon_unknown_0::StringHasher::matches(this_00,a,(StringPtr)local_90);
        if (bVar1) {
          uVar2 = kj::_::HashBucket::getPos(local_58);
          local_98 = (ulong)uVar2;
          Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_98);
          aVar5 = extraout_RDX_01;
          goto LAB_001ef9f3;
        }
      }
      sVar3 = kj::_::probeHash((Array<kj::_::HashBucket> *)(this_00 + 0x10),(ulong)bucket._4_4_);
      bucket._4_4_ = (uint)sVar3;
    }
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
    aVar5 = extraout_RDX_00;
  }
LAB_001ef9f3:
  MVar6.ptr.field_1.value = aVar5.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }